

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::bracketElse(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Cell CVar1;
  Cell CVar2;
  uint uVar3;
  uint src;
  int iVar4;
  int iVar5;
  char cVar6;
  string currentWord;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->dStack;
  iVar5 = 1;
LAB_00119fd3:
  CVar1 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
  CVar2 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
  if (0 < (int)(CVar1 - CVar2)) goto code_r0x00119ffb;
  goto LAB_0011a105;
code_r0x00119ffb:
  requireDStackAvailable(this,1,"BL");
  ForthStack<unsigned_int>::push(this_00,0x20);
  word(this);
  count(this);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar3 == 0) {
    cVar6 = '\x05';
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    moveFromDataSpace(this,&local_50,src,(ulong)uVar3);
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_50,"[IF]");
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_50,"[ELSE]");
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_50,"[THEN]");
        iVar5 = iVar5 - (uint)(iVar4 != 0);
        cVar6 = iVar5 == 0;
      }
      else {
        cVar6 = false;
        if (iVar5 == 1) {
          iVar5 = 0;
        }
      }
    }
    else {
      cVar6 = false;
      iVar5 = iVar5 + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
  }
  if (cVar6 != '\0') {
    if (cVar6 != '\x05') {
      return;
    }
LAB_0011a105:
    refillNextLine(this);
  }
  goto LAB_00119fd3;
}

Assistant:

void bracketElse(){
			int level = 1;
			while (true){
				while (getSourceBufferRemain() > 0 ) {
					bl();
					word();
					count();
					auto length = SIZE_T(dStack.getTop()); pop();
					auto caddr = CADDR(dStack.getTop()); pop();
					if (length > 0) {
						std::string currentWord{};
						moveFromDataSpace(currentWord, caddr, length);
						if (currentWord.compare("[IF]")) { level++; }
						else {
							if (currentWord.compare("[ELSE]")) { level--; if (level) level++; }
							else {
								if (currentWord.compare("[THEN]")) { level--; }
								if (level == 0) return;
							}
						}
					}
					else {
						break;
					}
				}
				refillNextLine();
			}
		}